

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.h
# Opt level: O0

void quicly_loss_update_alarm
               (quicly_loss_t *r,int64_t now,int64_t last_retransmittable_sent_at,
               int has_outstanding,int can_send_stream_data,int handshake_is_in_progress,
               uint64_t total_bytes_sent,int is_after_send)

{
  uint32_t uVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  ulong in_stack_00000008;
  int in_stack_00000010;
  int64_t _t_1;
  int64_t alarm_duration;
  int64_t _t;
  uint32_t local_4c;
  long local_40;
  ulong local_38;
  long local_30;
  
  if (in_ECX == 0) {
    in_RDI[0xb] = 0x7fffffffffffffff;
    in_RDI[10] = 0x7fffffffffffffff;
  }
  else {
    if (in_RDX == 0x7fffffffffffffff) {
      __assert_fail("last_retransmittable_sent_at != INT64_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                    ,0x101,
                    "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                   );
    }
    if (in_RDI[10] == 0x7fffffffffffffff) {
      if ('>' < (char)in_RDI[3]) {
        __assert_fail("r->pto_count < 63",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                      ,0x116,
                      "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                     );
      }
      if ((((*(char *)(*in_RDI + 0xc) != '\0') && ((char)in_RDI[3] < '\x01')) && (in_R9D == 0)) &&
         ((in_R8D == 0 && ((ulong)in_RDI[9] < in_stack_00000008)))) {
        if ((char)in_RDI[3] == '\0') {
          *(char *)(in_RDI + 3) = -*(char *)(*in_RDI + 0xc);
        }
        in_RDI[9] = in_stack_00000008;
      }
      if ((char)in_RDI[3] < '\0') {
        uVar1 = quicly_rtt_get_pto((quicly_rtt_t *)(in_RDI + 0xc),0,*(uint32_t *)(*in_RDI + 4));
        local_38 = (long)(ulong)uVar1 >> (-(char)in_RDI[3] & 0x3fU);
        if ((long)local_38 < (long)(ulong)*(uint *)(*in_RDI + 4)) {
          local_38 = (ulong)*(uint *)(*in_RDI + 4);
        }
      }
      else {
        if (in_R9D == 0) {
          local_4c = (uint32_t)*(ushort *)in_RDI[1];
        }
        else {
          local_4c = 0;
        }
        uVar1 = quicly_rtt_get_pto((quicly_rtt_t *)(in_RDI + 0xc),local_4c,
                                   *(uint32_t *)(*in_RDI + 4));
        local_38 = (ulong)uVar1 << (*(byte *)(in_RDI + 3) & 0x3f);
      }
      local_40 = in_RDX + local_38;
      if (in_stack_00000010 == 0) {
        if (local_40 < in_RSI) {
          local_40 = in_RSI;
        }
      }
      else if (local_40 <= in_RSI) {
        __assert_fail("now < _t",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                      ,0x138,
                      "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                     );
      }
      in_RDI[0xb] = local_40;
    }
    else {
      local_30 = in_RDI[10];
      if (in_stack_00000010 == 0) {
        if (local_30 < in_RSI) {
          local_30 = in_RSI;
        }
      }
      else if (local_30 <= in_RSI) {
        __assert_fail("now < _t",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                      ,0x110,
                      "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                     );
      }
      in_RDI[0xb] = local_30;
    }
  }
  return;
}

Assistant:

inline void quicly_loss_update_alarm(quicly_loss_t *r, int64_t now, int64_t last_retransmittable_sent_at, int has_outstanding,
                                     int can_send_stream_data, int handshake_is_in_progress, uint64_t total_bytes_sent,
                                     int is_after_send)
{
    if (!has_outstanding) {
        /* Do not set alarm if there's no data oustanding */
        r->alarm_at = INT64_MAX;
        r->loss_time = INT64_MAX;
        return;
    }
    assert(last_retransmittable_sent_at != INT64_MAX);

#define SET_ALARM(t)                                                                                                               \
    do {                                                                                                                           \
        int64_t _t = (t);                                                                                                          \
        if (is_after_send) {                                                                                                       \
            assert(now < _t);                                                                                                      \
        } else if (_t < now) {                                                                                                     \
            _t = now;                                                                                                              \
        }                                                                                                                          \
        r->alarm_at = _t;                                                                                                          \
    } while (0)

    /* time-threshold loss detection */
    if (r->loss_time != INT64_MAX) {
        SET_ALARM(r->loss_time);
        return;
    }

    /* PTO alarm */
    int64_t alarm_duration;
    assert(r->pto_count < 63);
    /* Probes are sent with a modified backoff to minimize latency of recovery. For instance, with num_speculative_ptos set to
     * 2, the backoff pattern is as follows:
     *   * when there's a tail: 0.25, 0.5, 1, 2, 4, 8, ...
     *   * when mid-transfer: 1, 1, 1, 2, 4, 8, ...
     * The first 2 probes in this case (and num_speculative_ptos, more generally), or the probes sent when pto_count < 0, are
     * the speculative ones, which add potentially redundant retransmissions at a tail to reduce the cost of potential tail
     * losses.
     *
     * FIXME: use of `can_send_stream_data` and `bytes_sent` is not entirely correct, it does not take things like MAX_ frames
     * and pending.flows into consideration.
     */
    if (r->conf->num_speculative_ptos > 0 && r->pto_count <= 0 && !handshake_is_in_progress && !can_send_stream_data &&
        r->total_bytes_sent < total_bytes_sent) {
        /* New tail, defined as (i) sender is not in PTO recovery, (ii) there is no stream data to send, and
         * (iii) new application data was sent since the last tail. Move the pto_count back to kick off speculative probing. */
        if (r->pto_count == 0)
            /*  kick off speculative probing if not already in progress */
            r->pto_count = -r->conf->num_speculative_ptos;
        r->total_bytes_sent = total_bytes_sent;
    }
    if (r->pto_count < 0) {
        /* Speculative probes sent under an RTT do not need to account for ack delay, since there is no expectation
         * of an ack being received before the probe is sent. */
        alarm_duration = quicly_rtt_get_pto(&r->rtt, 0, r->conf->min_pto);
        alarm_duration >>= -r->pto_count;
        if (alarm_duration < r->conf->min_pto)
            alarm_duration = r->conf->min_pto;
    } else {
        /* Ordinary PTO. The bitshift below is fine; it would take more than a millenium to overflow either alarm_duration or
         * pto_count, even when the timer granularity is nanosecond */
        alarm_duration = quicly_rtt_get_pto(&r->rtt, handshake_is_in_progress ? 0 : *r->max_ack_delay, r->conf->min_pto);
        alarm_duration <<= r->pto_count;
    }
    SET_ALARM(last_retransmittable_sent_at + alarm_duration);

#undef SET_ALARM
}